

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

void phyr::blackbody(double *lambda,int n,double t,double *Le)

{
  long in_RDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double lambda5;
  double l;
  int i_1;
  double kb;
  double h;
  double c;
  int i;
  undefined4 local_44;
  undefined4 local_24;
  
  if (0.0 < in_XMM0_Qa) {
    for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
      dVar1 = *(double *)(in_RDI + (long)local_44 * 8) * 1e-09;
      dVar2 = exp(1.9864456832693028e-25 / (dVar1 * 1.3806488e-23 * in_XMM0_Qa));
      *(double *)(in_RDX + (long)local_44 * 8) =
           1.1910428681415875e-16 / (dVar1 * dVar1 * dVar1 * dVar1 * dVar1 * (dVar2 - 1.0));
    }
  }
  else {
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      *(undefined8 *)(in_RDX + (long)local_24 * 8) = 0;
    }
  }
  return;
}

Assistant:

void blackbody(const Real* lambda, int n, Real t, Real* Le) {
    if (t <= 0) {
        for (int i = 0; i < n; ++i) Le[i] = 0.f;
        return;
    }
    const Real c = 299792458;
    const Real h = 6.62606957e-34;
    const Real kb = 1.3806488e-23;
    for (int i = 0; i < n; ++i) {
        // Compute emitted radiance for blackbody at wavelength {lambda[i]}
        Real l = lambda[i] * 1e-9;
        Real lambda5 = (l * l) * (l * l) * l;
        Le[i] = (2 * h * c * c) /
                (lambda5 * (std::exp((h * c) / (l * kb * t)) - 1));
        ASSERT(!std::isnan(Le[i]));
    }
}